

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

bool __thiscall ObjectFile::abortTransaction(ObjectFile *this)

{
  bool bVar1;
  MutexLocker lock;
  
  MutexLocker::MutexLocker(&lock,this->objectMutex);
  if (this->inTransaction == true) {
    if (this->transactionLockFile == (File *)0x0) {
      bVar1 = false;
      softHSMLog(3,"abortTransaction",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x349,"Transaction lock file instance invalid!");
    }
    else {
      File::unlock(this->transactionLockFile);
      if (this->transactionLockFile != (File *)0x0) {
        (*this->transactionLockFile->_vptr_File[1])();
      }
      this->transactionLockFile = (File *)0x0;
      this->inTransaction = false;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  MutexLocker::~MutexLocker(&lock);
  if (bVar1 != false) {
    refresh(this,true);
  }
  return bVar1;
}

Assistant:

bool ObjectFile::abortTransaction()
{
	{
		MutexLocker lock(objectMutex);

		if (!inTransaction)
		{
			return false;
		}

		if (transactionLockFile == NULL)
		{
			ERROR_MSG("Transaction lock file instance invalid!");

			return false;
		}

		transactionLockFile->unlock();

		delete transactionLockFile;
		transactionLockFile = NULL;
		inTransaction = false;
	}

	// Force reload from disk
	refresh(true);

	return true;
}